

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<char_const(&)[32],wabt::(anonymous_namespace)::GlobalName,char_const(&)[9],wabt::(anonymous_namespace)::Newline>
          (CWriter *this,char (*t) [32],GlobalName *u,char (*args) [9],Newline *args_1)

{
  size_t size;
  
  size = strlen(*t);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,*t,size);
  anon_unknown_0::CWriter::Write((CWriter *)this,u);
  anon_unknown_0::CWriter::WriteData((CWriter *)this," = true;",8);
  anon_unknown_0::CWriter::Write((CWriter *)this);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }